

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_decode_pad(pt_packet_decoder *decoder,pt_packet *packet)

{
  pt_packet *packet_local;
  pt_packet_decoder *decoder_local;
  
  if (packet == (pt_packet *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    packet->type = ppt_pad;
    packet->size = '\x01';
    decoder_local._4_4_ = 1;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_pkt_decode_pad(struct pt_packet_decoder *decoder,
			     struct pt_packet *packet)
{
	(void) decoder;

	if (!packet)
		return -pte_internal;

	packet->type = ppt_pad;
	packet->size = ptps_pad;

	return ptps_pad;
}